

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuItemKeys> *list)

{
  long lVar1;
  byte bVar2;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QDBusMenuItemKeys item;
  QDBusMenuItemKeys *in_stack_ffffffffffffffb8;
  QList<QDBusMenuItemKeys> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuItemKeys>::clear(in_stack_ffffffffffffffc0);
  while( true ) {
    bVar2 = QDBusArgument::atEnd();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    QDBusMenuItemKeys::QDBusMenuItemKeys((QDBusMenuItemKeys *)0xb16b90);
    operator>>((QDBusArgument *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    QList<QDBusMenuItemKeys>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    QDBusMenuItemKeys::~QDBusMenuItemKeys((QDBusMenuItemKeys *)0xb16bb8);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}